

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxGetDefaultByType::Resolve(FxGetDefaultByType *this,FCompileContext *ctx)

{
  PType *p;
  PString *pPVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PClassPointer *pPVar4;
  PClass *p_00;
  PClassActor *restrict;
  FxExpression *pFVar5;
  PPointer *pPVar6;
  PClassActor *pPVar7;
  FScriptPosition *pFVar8;
  PString *local_40;
  FString local_38;
  ExpVal local_30;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar3 = (*this->Self->_vptr_FxExpression[2])();
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  pFVar5 = this->Self;
  if (pFVar5 == (FxExpression *)0x0) {
LAB_00538cbf:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  p = pFVar5->ValueType;
  if ((p == (PType *)TypeString) || (p == (PType *)TypeName)) {
    iVar3 = (*pFVar5->_vptr_FxExpression[3])();
    if ((char)iVar3 == '\0') {
      local_40 = (PString *)this->Self[1]._vptr_FxExpression;
      pFVar8 = &this->Self[1].ScriptPosition;
      if (local_40 == TypeString) {
        FString::AttachToOther(&local_38,&pFVar8->FileName);
      }
      else {
        local_38.Chars = (pFVar8->FileName).Chars;
      }
      ExpVal::GetString(&local_30);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "GetDefaultByType() requires an actor class type, but got %s",
                 CONCAT44(local_30.Type._4_4_,local_30.Type._0_4_));
    }
    else {
      pPVar1 = (PString *)this->Self[1]._vptr_FxExpression;
      pFVar8 = &this->Self[1].ScriptPosition;
      if (pPVar1 == TypeString) {
        FString::AttachToOther(&local_38,&pFVar8->FileName);
      }
      else {
        local_38.Chars = (pFVar8->FileName).Chars;
      }
      ExpVal::GetName((ExpVal *)((long)&local_30.field_1 + 4));
      local_30.Type._0_4_ = local_30.field_1._4_4_;
      p_00 = PClass::FindClass((FName *)&local_30);
      restrict = dyn_cast<PClassActor>((DObject *)p_00);
      if (pPVar1 == TypeString) {
        FString::~FString(&local_38);
      }
      if (restrict != (PClassActor *)0x0) {
        pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        pPVar4 = NewClassPointer(&restrict->super_PClass);
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  (&pFVar5->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
        pFVar5->ExprType = EFX_Constant;
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
        pFVar5[1].ScriptPosition.FileName.Chars = (char *)restrict;
        pFVar5->ValueType = (PType *)pPVar4;
        pFVar5[1]._vptr_FxExpression = (_func_int **)pPVar4;
        pFVar5->isresolved = true;
        pFVar5->NeedResult = true;
        this->Self = pFVar5;
        goto LAB_00538bff;
      }
      local_40 = (PString *)this->Self[1]._vptr_FxExpression;
      pFVar8 = &this->Self[1].ScriptPosition;
      if (local_40 == TypeString) {
        FString::AttachToOther(&local_38,&pFVar8->FileName);
      }
      else {
        local_38.Chars = (pFVar8->FileName).Chars;
      }
      ExpVal::GetString(&local_30);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "GetDefaultByType() requires an actor class type, but got %s",
                 CONCAT44(local_30.Type._4_4_,local_30.Type._0_4_));
    }
    FString::~FString((FString *)&local_30);
    if (local_40 == TypeString) {
      FString::~FString(&local_38);
    }
    goto LAB_00538cbf;
  }
  pPVar4 = dyn_cast<PClassPointer>((DObject *)p);
  if (pPVar4 == (PClassPointer *)0x0) {
LAB_00538acc:
    restrict = (PClassActor *)0x0;
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,
               "GetDefaultByType() requires an actor class type");
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    bVar2 = false;
  }
  else {
    restrict = (PClassActor *)pPVar4->ClassRestriction;
    bVar2 = true;
    pPVar7 = restrict;
    if (restrict != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
        if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar7 != (PClassActor *)0x0);
      if (pPVar7 == (PClassActor *)0x0) goto LAB_00538acc;
    }
  }
  if (!bVar2) {
    return (FxExpression *)0x0;
  }
LAB_00538bff:
  pPVar6 = NewPointer((PType *)restrict,true);
  (this->super_FxExpression).ValueType = (PType *)pPVar6;
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxGetDefaultByType::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	PClass *cls = nullptr;

	if (Self->ValueType == TypeString || Self->ValueType == TypeName)
	{
		if (Self->isConstant())
		{
			cls = PClass::FindActor(static_cast<FxConstant *>(Self)->GetValue().GetName());
			if (cls == nullptr)
			{
				ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
				delete this;
				return nullptr;
			}
			Self = new FxConstant(cls, NewClassPointer(cls), ScriptPosition);
		}
		else
		{
			// this is the ugly case. We do not know what we have and cannot do proper type casting.
			// For now error out and let this case require explicit handling on the user side.
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		auto cp = dyn_cast<PClassPointer>(Self->ValueType);
		if (cp == nullptr || !cp->ClassRestriction->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type");
			delete this;
			return nullptr;
		}
		cls = cp->ClassRestriction;
	}
	ValueType = NewPointer(cls, true);
	return this;
}